

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCreateTable(Btree *p,Pgno *piTable,int flags)

{
  BtShared *pBt;
  int iVar1;
  Pgno PVar2;
  MemPage *pMVar3;
  Pgno pgno;
  long in_FS_OFFSET;
  Pgno local_60;
  u8 eType;
  MemPage *pPageMove;
  Pgno pgnoMove;
  int local_48;
  Pgno pgnoRoot;
  MemPage *pRoot;
  long local_38;
  uint uVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sqlite3BtreeEnter(p);
  pBt = p->pBt;
  pRoot = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
  pgnoRoot = 0xaaaaaaaa;
  if (pBt->autoVacuum == '\0') {
    iVar1 = allocateBtreePage(pBt,&pRoot,&pgnoRoot,1,'\0');
    pMVar3 = pRoot;
    local_48 = iVar1;
    if (iVar1 != 0) goto LAB_00148ec4;
LAB_00148dc8:
    zeroPage(pMVar3,(flags & 1U) * 3 + 10);
    sqlite3PagerUnref(pMVar3->pDbPage);
    *piTable = pgnoRoot;
    iVar1 = 0;
  }
  else {
    pgnoMove = 0xaaaaaaaa;
    pPageMove = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
    invalidateAllOverflowCache(pBt);
    sqlite3BtreeGetMeta(p,4,&pgnoRoot);
    iVar1 = sqlite3PendingByte;
    pgno = pgnoRoot;
    if (pBt->nPage < pgnoRoot) {
      iVar1 = sqlite3CorruptError(0x13b8b);
      goto LAB_00148ec4;
    }
    do {
      do {
        uVar4 = pgno;
        pgno = uVar4 + 1;
        PVar2 = ptrmapPageno(pBt,pgno);
      } while (pgno == PVar2);
    } while (uVar4 == (uint)iVar1 / pBt->pageSize);
    pgnoRoot = pgno;
    iVar1 = allocateBtreePage(pBt,&pPageMove,&pgnoMove,pgno,'\x01');
    PVar2 = pgnoMove;
    local_48 = iVar1;
    if (iVar1 != 0) goto LAB_00148ec4;
    if (pgnoMove == pgno) {
      pRoot = pPageMove;
      pMVar3 = pPageMove;
LAB_00148e59:
      ptrmapPut(pBt,pgno,'\x01',0,&local_48);
      iVar1 = local_48;
      if ((local_48 == 0) &&
         (iVar1 = sqlite3BtreeUpdateMeta(p,4,pgno), local_48 = iVar1, iVar1 == 0))
      goto LAB_00148dc8;
    }
    else {
      eType = '\0';
      local_60 = 0;
      iVar1 = saveAllCursors(pBt,0,(BtCursor *)0x0);
      releasePage(pPageMove);
      if ((iVar1 != 0) || (iVar1 = btreeGetPage(pBt,pgno,&pRoot,0), iVar1 != 0)) goto LAB_00148ec4;
      iVar1 = ptrmapGet(pBt,pgno,&eType,&local_60);
      pMVar3 = pRoot;
      if ((byte)(eType - 1) < 2) {
        iVar1 = sqlite3CorruptError(0x13bbb);
        pMVar3 = pRoot;
      }
      else if (iVar1 == 0) {
        iVar1 = relocatePage(pBt,pRoot,eType,local_60,PVar2,0);
        releasePage(pMVar3);
        if ((iVar1 != 0) || (iVar1 = btreeGetPage(pBt,pgno,&pRoot,0), pMVar3 = pRoot, iVar1 != 0))
        goto LAB_00148ec4;
        iVar1 = sqlite3PagerWrite(pRoot->pDbPage);
        local_48 = iVar1;
        if (iVar1 != 0) {
          releasePageNotNull(pMVar3);
          goto LAB_00148ec4;
        }
        goto LAB_00148e59;
      }
    }
    releasePage(pMVar3);
  }
LAB_00148ec4:
  sqlite3BtreeLeave(p);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, Pgno *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}